

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

bool __thiscall soul::AST::EndpointDetails::isResolved(EndpointDetails *this)

{
  bool bVar1;
  Expression *e;
  bool local_61;
  pool_ptr<soul::AST::Expression> local_40;
  pool_ref<soul::AST::Expression> *local_38;
  pool_ref<soul::AST::Expression> *t;
  pool_ref<soul::AST::Expression> *__end2;
  pool_ref<soul::AST::Expression> *__begin2;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *__range2;
  EndpointDetails *this_local;
  
  __begin2 = (pool_ref<soul::AST::Expression> *)&this->dataTypes;
  __range2 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *)this;
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::begin
                     ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *)__begin2
                     );
  t = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::end
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *)__begin2);
  do {
    if (__end2 == t) {
      bVar1 = pool_ptr<soul::AST::Expression>::operator==(&this->arraySize,(void *)0x0);
      local_61 = true;
      if (!bVar1) {
        local_40.object = (this->arraySize).object;
        local_61 = isResolvedAsConstant(&local_40);
      }
      this_local._7_1_ = local_61;
      if (!bVar1) {
        pool_ptr<soul::AST::Expression>::~pool_ptr(&local_40);
      }
LAB_0039fb77:
      return (bool)(this_local._7_1_ & 1);
    }
    local_38 = __end2;
    e = pool_ref<soul::AST::Expression>::get(__end2);
    bVar1 = isResolvedAsType(e);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_0039fb77;
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

bool isResolved() const
        {
            for (auto& t : dataTypes)
                if (! isResolvedAsType (t.get()))
                    return false;

            return arraySize == nullptr || isResolvedAsConstant (arraySize);
        }